

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

uint32_t LogLuv24fromXYZ(float *XYZ,int em)

{
  int iVar1;
  double dVar2;
  double s;
  double v;
  double u;
  int Ce;
  int Le;
  int em_local;
  float *XYZ_local;
  
  iVar1 = LogL10fromY((double)XYZ[1],em);
  dVar2 = (double)XYZ[2] * 3.0 + (double)XYZ[1] * 15.0 + (double)*XYZ;
  if ((iVar1 == 0) || (dVar2 <= 0.0)) {
    v = 0.210526316;
    s = 0.473684211;
  }
  else {
    v = ((double)*XYZ * 4.0) / dVar2;
    s = ((double)XYZ[1] * 9.0) / dVar2;
  }
  u._4_4_ = uv_encode(v,s,em);
  if ((int)u._4_4_ < 0) {
    u._4_4_ = uv_encode(0.210526316,0.473684211,0);
  }
  return iVar1 << 0xe | u._4_4_;
}

Assistant:

uint32_t
    LogLuv24fromXYZ(float *XYZ, int em)
{
    int Le, Ce;
    double u, v, s;
    /* encode luminance */
    Le = LogL10fromY(XYZ[1], em);
    /* encode color */
    s = XYZ[0] + 15. * XYZ[1] + 3. * XYZ[2];
    if (!Le || s <= 0.)
    {
        u = U_NEU;
        v = V_NEU;
    }
    else
    {
        u = 4. * XYZ[0] / s;
        v = 9. * XYZ[1] / s;
    }
    Ce = uv_encode(u, v, em);
    if (Ce < 0) /* never happens */
        Ce = uv_encode(U_NEU, V_NEU, SGILOGENCODE_NODITHER);
    /* combine encodings */
    return (Le << 14 | Ce);
}